

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::unregister
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          HitCounter **ptr)

{
  HitCounter *pHVar1;
  bool bVar2;
  reference ppHVar3;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  *__i;
  long *in_RSI;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *in_RDI;
  iterator iter;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  const_iterator in_stack_ffffffffffffffc8;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_18;
  long *local_10;
  
  if (*in_RSI != 0) {
    local_10 = in_RSI;
    local_18._M_current =
         (HitCounter **)
         (*(code *)(in_RDI->
                   super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[5])();
    while( true ) {
      (*(code *)(in_RDI->
                super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[6])();
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
      if ((!bVar2) ||
         (pHVar1 = (HitCounter *)*local_10,
         ppHVar3 = __gnu_cxx::
                   __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                   ::operator*(&local_18), pHVar1 == *ppHVar3)) break;
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ::operator++(&local_18);
    }
    (*(code *)(in_RDI->
              super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>).
              _M_impl.super__Vector_impl_data._M_start[6])();
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    uVar4 = false;
    if (bVar2) {
      ppHVar3 = __gnu_cxx::
                __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                ::operator*(&local_18);
      uVar4 = *ppHVar3 != (HitCounter *)0x0;
    }
    if ((bool)uVar4 != false) {
      __i = (__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
             *)(*(code *)(in_RDI->
                         super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[0xb])();
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter*const*,std::vector<el::base::HitCounter*,std::allocator<el::base::HitCounter*>>>
      ::__normal_iterator<el::base::HitCounter**>
                ((__normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                  *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),__i);
      std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::erase
                (in_RDI,in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ::operator*(&local_18);
      safeDelete<el::base::HitCounter>((HitCounter **)CONCAT17(uVar4,in_stack_ffffffffffffffb0));
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }